

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *
adios2::utils::get_local_array_signature<long_double>
          (Engine *fp,IO *io,Variable<long_double> *variable)

{
  long *plVar1;
  bool bVar2;
  undefined8 uVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  size_type sVar8;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  *pvVar9;
  reference ppVar10;
  long in_RCX;
  long *in_RSI;
  pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *in_RDI;
  size_t k_4;
  size_t j_2;
  size_t blocksSize;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  *blocks_1;
  pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>
  *blockpair;
  iterator __end0;
  iterator __begin0;
  map<unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
  *__range4;
  map<unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
  allblocks;
  size_t k_3;
  size_t k_2;
  MinBlockInfo *coreBlockInfo;
  iterator __end5;
  iterator __begin5;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *__range5;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *coreBlocksInfo;
  size_t RelStep;
  MinVarInfo *minBlocksInfo;
  bool firstBlock_2;
  bool firstStep;
  size_t k_1;
  size_t j_1;
  bool firstBlock_1;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  blocks;
  size_t k;
  size_t j;
  bool firstBlock;
  MinVarInfo *minBlocks;
  Dims dims;
  size_t nblocks;
  size_t ndim;
  map<unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
  *in_stack_fffffffffffffdc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdd0;
  allocator_type *in_stack_fffffffffffffdd8;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  value_type vVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdf0;
  ulong uVar12;
  size_type local_178;
  ulong local_170;
  _Self local_150;
  _Self local_148;
  Variable *local_140;
  Variable local_138 [48];
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  *local_108;
  ulong local_100;
  reference local_f8;
  MinBlockInfo *local_f0;
  __normal_iterator<adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
  local_e8;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *local_e0;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *local_d8;
  ulong local_d0;
  long local_c8;
  byte local_ba;
  byte local_b9;
  size_type local_b8;
  ulong local_b0;
  byte local_a1;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  local_a0;
  size_type local_88;
  ulong local_80;
  byte local_71;
  long local_70;
  undefined8 local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  size_type local_30;
  size_type local_28;
  long local_20;
  long *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RCX + 0x88));
  local_30 = 0;
  local_50 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1c0443);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (value_type_conflict1 *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1c0477);
  plVar1 = local_10;
  if ((timestep & 1) == 0) {
    local_b9 = 1;
    local_ba = 1;
    local_c8 = 0;
    local_c8 = (**(code **)(*local_10 + 0x58))(local_10,local_20,0);
    if (local_c8 == 0) {
      adios2::core::Engine::AllStepsBlocksInfo<long_double>(local_138);
      local_140 = local_138;
      local_148._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
           ::begin(in_stack_fffffffffffffdc8);
      local_150._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
           ::end(in_stack_fffffffffffffdc8);
      while (bVar2 = std::operator!=(&local_148,&local_150), bVar2) {
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>
                               *)in_stack_fffffffffffffdd0);
        pvVar9 = &ppVar10->second;
        sVar7 = std::
                vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                ::size(pvVar9);
        sVar8 = sVar7;
        if (((local_b9 & 1) == 0) && (sVar8 = local_30, local_30 != sVar7)) {
          local_30 = 0;
          sVar8 = local_30;
        }
        local_30 = sVar8;
        for (local_170 = 0; local_170 < sVar7; local_170 = local_170 + 1) {
          for (local_178 = 0; local_178 < local_28; local_178 = local_178 + 1) {
            if ((local_ba & 1) == 0) {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_48,local_178);
              in_stack_fffffffffffffdd0 =
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar5;
              pvVar6 = std::
                       vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                       ::operator[](pvVar9,local_170);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&pvVar6->Count,local_178);
              if (in_stack_fffffffffffffdd0 !=
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar5) {
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_48,local_178);
                *pvVar5 = 0;
              }
            }
            else {
              pvVar6 = std::
                       vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                       ::operator[](pvVar9,local_170);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&pvVar6->Count,local_178);
              in_stack_fffffffffffffdd8 = (allocator_type *)*pvVar5;
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_48,local_178);
              *pvVar5 = (value_type)in_stack_fffffffffffffdd8;
            }
          }
          local_ba = 0;
        }
        local_b9 = 0;
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>
                      *)in_stack_fffffffffffffdd0);
      }
      std::
      map<unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
      ::~map((map<unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>_>_>_>
              *)0x1c0e32);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      for (local_d0 = 0; local_d0 < *(ulong *)(local_20 + 0xf8); local_d0 = local_d0 + 1) {
        if (local_d0 != 0) {
          local_c8 = (**(code **)(*local_10 + 0x58))(local_10,local_20,local_d0);
        }
        sVar8 = local_30;
        local_d8 = (vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                   (local_c8 + 0x20);
        if ((local_b9 & 1) == 0) {
          sVar7 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                            (local_d8);
          if (sVar8 != sVar7) {
            local_30 = 0;
          }
        }
        else {
          local_30 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                               (local_d8);
        }
        local_e0 = local_d8;
        local_e8._M_current =
             (MinBlockInfo *)
             std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::begin
                       ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                        in_stack_fffffffffffffdc8);
        local_f0 = (MinBlockInfo *)
                   std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::end
                             ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *
                              )in_stack_fffffffffffffdc8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                                   *)in_stack_fffffffffffffdd0,
                                  (__normal_iterator<adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                                   *)in_stack_fffffffffffffdc8), bVar2) {
          local_f8 = __gnu_cxx::
                     __normal_iterator<adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                     ::operator*(&local_e8);
          if ((local_ba & 1) == 0) {
            local_108 = (vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                         *)0x0;
            while (in_stack_fffffffffffffde0 = local_108,
                  pvVar9 = (vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                            *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                        (&local_48), in_stack_fffffffffffffde0 < pvVar9) {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_48,(size_type)local_108);
              if (*pvVar5 != *(value_type *)(*(long *)(local_f8 + 0x18) + (long)local_108 * 8)) {
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_48,(size_type)local_108);
                *pvVar5 = 0;
              }
              local_108 = (vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                           *)((long)&(local_108->
                                     super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
            }
          }
          else {
            local_100 = 0;
            while (uVar12 = local_100,
                  sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                    (&local_48), uVar12 < sVar8) {
              vVar11 = *(value_type *)(*(long *)(local_f8 + 0x18) + local_100 * 8);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_48,local_100);
              *pvVar5 = vVar11;
              local_100 = local_100 + 1;
            }
          }
          local_ba = 0;
          __gnu_cxx::
          __normal_iterator<adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
          ::operator++(&local_e8);
        }
        local_b9 = 0;
      }
    }
  }
  else {
    uVar3 = (**(code **)(*local_10 + 0x20))();
    local_70 = (**(code **)(*plVar1 + 0x58))(plVar1,local_20,uVar3);
    if (local_70 == 0) {
      (**(code **)(*local_10 + 0x20))();
      adios2::core::Engine::BlocksInfo<long_double>((Variable *)&local_a0,(ulong)local_10);
      bVar2 = std::
              vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
              ::empty(in_stack_fffffffffffffde0);
      if (!bVar2) {
        local_30 = std::
                   vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                   ::size(&local_a0);
        local_a1 = 1;
        for (local_b0 = 0; local_b0 < local_30; local_b0 = local_b0 + 1) {
          for (local_b8 = 0; local_b8 < local_28; local_b8 = local_b8 + 1) {
            if ((local_a1 & 1) == 0) {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_48,local_b8);
              vVar11 = *pvVar5;
              pvVar6 = std::
                       vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                       ::operator[](&local_a0,local_b0);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&pvVar6->Count,local_b8);
              if (vVar11 != *pvVar5) {
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&local_48,local_b8);
                *pvVar5 = 0;
              }
            }
            else {
              pvVar6 = std::
                       vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                       ::operator[](&local_a0,local_b0);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&pvVar6->Count,local_b8);
              vVar11 = *pvVar5;
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_48,local_b8);
              *pvVar5 = vVar11;
            }
          }
          local_a1 = 0;
        }
      }
      std::
      vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
      ::~vector(in_stack_fffffffffffffde0);
    }
    else {
      local_71 = 1;
      local_30 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                           ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                            (local_70 + 0x20));
      for (local_80 = 0; local_80 < local_30; local_80 = local_80 + 1) {
        for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
          if ((local_71 & 1) == 0) {
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_48,local_88);
            vVar11 = *pvVar5;
            pvVar4 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                     operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                 *)(local_70 + 0x20),local_80);
            if (vVar11 != *(value_type *)(*(long *)(pvVar4 + 0x18) + local_88 * 8)) {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_48,local_88);
              *pvVar5 = 0;
            }
          }
          else {
            pvVar4 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                     operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                 *)(local_70 + 0x20),local_80);
            vVar11 = *(value_type *)(*(long *)(pvVar4 + 0x18) + local_88 * 8);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_48,local_88);
            *pvVar5 = vVar11;
          }
        }
        local_71 = 0;
      }
    }
  }
  std::make_pair<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
            ((unsigned_long *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde0);
  return in_RDI;
}

Assistant:

std::pair<size_t, Dims> get_local_array_signature(core::Engine *fp, core::IO *io,
                                                  core::Variable<T> *variable)
{
    const size_t ndim = variable->m_Count.size();
    size_t nblocks = 0;
    Dims dims(ndim, 0);

    if (timestep)
    {
        const auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

        if (minBlocks)
        {
            bool firstBlock = true;
            nblocks = minBlocks->BlocksInfo.size();
            for (size_t j = 0; j < nblocks; j++)
            {
                for (size_t k = 0; k < ndim; k++)
                {
                    if (firstBlock)
                    {
                        dims[k] = minBlocks->BlocksInfo[j].Count[k];
                    }
                    else if (dims[k] != minBlocks->BlocksInfo[j].Count[k])
                    {
                        dims[k] = 0;
                    }
                }
                firstBlock = false;
            }
        }
        else
        {
            std::vector<typename core::Variable<T>::BPInfo> blocks =
                fp->BlocksInfo(*variable, fp->CurrentStep());
            if (!blocks.empty())
            {
                nblocks = blocks.size();
                bool firstBlock = true;
                for (size_t j = 0; j < nblocks; j++)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstBlock)
                        {
                            dims[k] = blocks[j].Count[k];
                        }
                        else if (dims[k] != blocks[j].Count[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstBlock = false;
                }
            }
        }
    }
    else
    {
        bool firstStep = true;
        bool firstBlock = true;

        MinVarInfo *minBlocksInfo = nullptr;
        minBlocksInfo = fp->MinBlocksInfo(*variable, 0 /* relative step 0 */);

        // first step
        if (minBlocksInfo)
        {
            dims.resize(minBlocksInfo->Dims);
            size_t RelStep = 0;
            for (RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                if (RelStep > 0)
                {
                    minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                }

                auto &coreBlocksInfo = minBlocksInfo->BlocksInfo;
                if (firstStep)
                {
                    nblocks = coreBlocksInfo.size();
                }
                else if (nblocks != coreBlocksInfo.size())
                {
                    nblocks = 0;
                }
                for (auto &coreBlockInfo : coreBlocksInfo)
                {
                    if (firstBlock)
                    {
                        for (size_t k = 0; k < dims.size(); k++)
                        {
                            dims[k] = coreBlockInfo.Count[k];
                        }
                    }
                    else
                    {
                        for (size_t k = 0; k < dims.size(); k++)
                        {
                            if (dims[k] != coreBlockInfo.Count[k])
                            {
                                dims[k] = 0;
                            }
                        }
                    }
                    firstBlock = false;
                }
                firstStep = false;
            }
        }
        else
        {
            std::map<size_t, std::vector<typename core::Variable<T>::BPInfo>> allblocks =
                fp->AllStepsBlocksInfo(*variable);

            for (auto &blockpair : allblocks)
            {
                std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
                const size_t blocksSize = blocks.size();
                if (firstStep)
                {
                    nblocks = blocksSize;
                }
                else if (nblocks != blocksSize)
                {
                    nblocks = 0;
                }

                for (size_t j = 0; j < blocksSize; j++)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstBlock)
                        {
                            dims[k] = blocks[j].Count[k];
                        }
                        else if (dims[k] != blocks[j].Count[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstBlock = false;
                }
                firstStep = false;
            }
        }
    }
    return std::make_pair(nblocks, dims);
}